

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O1

int __thiscall ncnn::ConvolutionDepthWise::create_pipeline(ConvolutionDepthWise *this,Option *opt)

{
  size_t sVar1;
  int *piVar2;
  void *__ptr;
  Allocator *pAVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  Option opt_q;
  Mat local_1b8;
  Mat local_168;
  Mat local_118;
  Mat local_c8;
  Option local_78;
  
  if (((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 4)) &&
     (this->int8_scale_term != 0)) {
    local_1b8.cstep = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elempack = 0;
    local_1b8.allocator = (Allocator *)0x0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.c = 0;
    Mat::create(&local_1b8,this->weight_data_size,1,(Allocator *)0x0);
    bVar9 = local_1b8.data == (void *)0x0;
    bVar10 = (long)local_1b8.c * local_1b8.cstep == 0;
    if (!bVar9 && !bVar10) {
      iVar5 = this->weight_data_size / this->group;
      if (0 < this->group) {
        sVar7 = (size_t)iVar5;
        lVar8 = 0;
        lVar6 = 0;
        do {
          local_78.lightmode = opt->lightmode;
          local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
          local_78.num_threads = opt->num_threads;
          local_78.workspace_allocator = opt->workspace_allocator;
          local_78.openmp_blocktime = opt->openmp_blocktime;
          local_78.use_winograd_convolution = opt->use_winograd_convolution;
          local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
          local_78.use_int8_inference = opt->use_int8_inference;
          local_78.use_vulkan_compute = opt->use_vulkan_compute;
          uVar4._0_1_ = opt->use_bf16_storage;
          uVar4._1_1_ = opt->use_fp16_packed;
          uVar4._2_1_ = opt->use_fp16_storage;
          uVar4._3_1_ = opt->use_fp16_arithmetic;
          uVar4._4_1_ = opt->use_int8_packed;
          uVar4._5_1_ = opt->use_int8_storage;
          uVar4._6_1_ = opt->use_int8_arithmetic;
          uVar4._7_1_ = opt->use_packing_layout;
          local_78.use_shader_pack8 = opt->use_shader_pack8;
          local_78.use_subgroup_basic = opt->use_subgroup_basic;
          local_78.use_subgroup_vote = opt->use_subgroup_vote;
          local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
          local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
          local_78.use_image_storage = opt->use_image_storage;
          local_78.use_tensor_storage = opt->use_tensor_storage;
          local_78.use_reserved_0 = opt->use_reserved_0;
          local_78.flush_denormals = opt->flush_denormals;
          local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
          local_78.use_shader_local_memory = opt->use_shader_local_memory;
          local_78.use_cooperative_matrix = opt->use_cooperative_matrix;
          local_78.use_winograd23_convolution = opt->use_winograd23_convolution;
          local_78.use_winograd43_convolution = opt->use_winograd43_convolution;
          local_78.use_winograd63_convolution = opt->use_winograd63_convolution;
          local_78.use_reserved_6 = opt->use_reserved_6;
          local_78.use_reserved_7 = opt->use_reserved_7;
          local_78.use_reserved_8 = opt->use_reserved_8;
          local_78.use_reserved_9 = opt->use_reserved_9;
          local_78.use_reserved_10 = opt->use_reserved_10;
          local_78.use_reserved_11 = opt->use_reserved_11;
          local_78.blob_allocator = local_1b8.allocator;
          local_78._32_8_ = uVar4 & 0xffffffffffffff;
          sVar1 = (this->weight_data).elemsize;
          local_118.data = (void *)(sVar1 * lVar8 + (long)(this->weight_data).data);
          local_118.elempack = (this->weight_data).elempack;
          local_118.allocator = (this->weight_data).allocator;
          local_118.refcount._0_4_ = 0;
          local_118.refcount._4_4_ = 0;
          local_118.elemsize._0_4_ = (undefined4)sVar1;
          local_118.elemsize._4_4_ = (undefined4)(sVar1 >> 0x20);
          local_118.w = iVar5;
          local_118.dims = 1;
          local_118.h = 1;
          local_118.d = 1;
          local_118.c = 1;
          local_168.data =
               (void *)(CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize) * lVar8 +
                       (long)local_1b8.data);
          local_168.refcount._0_4_ = 0;
          local_168.refcount._4_4_ = 0;
          local_168.elemsize._0_4_ = (undefined4)local_1b8.elemsize;
          local_168.elemsize._4_4_ = local_1b8.elemsize._4_4_;
          local_168.elempack = local_1b8.elempack;
          local_168.allocator = local_1b8.allocator;
          local_168.w = iVar5;
          local_168.dims = 1;
          local_168.h = 1;
          local_168.d = 1;
          local_168.c = 1;
          sVar1 = (this->weight_data_int8_scales).elemsize;
          local_c8.data = (void *)(sVar1 * lVar6 + (long)(this->weight_data_int8_scales).data);
          local_c8.elempack = (this->weight_data_int8_scales).elempack;
          local_c8.allocator = (this->weight_data_int8_scales).allocator;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize._0_4_ = (undefined4)sVar1;
          local_c8.elemsize._4_4_ = (undefined4)(sVar1 >> 0x20);
          local_c8.dims = 1;
          local_c8.w = 1;
          local_c8.h = 1;
          local_c8.d = 1;
          local_c8.c = 1;
          local_c8.cstep = 1;
          local_168.cstep = sVar7;
          local_118.cstep = sVar7;
          quantize_to_int8(&local_118,&local_168,&local_c8,&local_78);
          piVar2 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (local_c8.allocator == (Allocator *)0x0) {
                if (local_c8.data != (void *)0x0) {
                  free(local_c8.data);
                }
              }
              else {
                (*(local_c8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_c8.cstep = 0;
          local_c8.data = (void *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize._0_4_ = 0;
          local_c8.elemsize._4_4_ = 0;
          local_c8.elempack = 0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          piVar2 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (local_168.allocator == (Allocator *)0x0) {
                if (local_168.data != (void *)0x0) {
                  free(local_168.data);
                }
              }
              else {
                (*(local_168.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_168.cstep = 0;
          local_168.data = (void *)0x0;
          local_168.refcount._0_4_ = 0;
          local_168.refcount._4_4_ = 0;
          local_168.elemsize._0_4_ = 0;
          local_168.elemsize._4_4_ = 0;
          local_168.elempack = 0;
          local_168.dims = 0;
          local_168.w = 0;
          local_168.h = 0;
          local_168.d = 0;
          local_168.c = 0;
          piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (local_118.allocator == (Allocator *)0x0) {
                if (local_118.data != (void *)0x0) {
                  free(local_118.data);
                }
              }
              else {
                (*(local_118.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_118.cstep = 0;
          local_118.data = (void *)0x0;
          local_118.refcount._0_4_ = 0;
          local_118.refcount._4_4_ = 0;
          local_118.elemsize._0_4_ = 0;
          local_118.elemsize._4_4_ = 0;
          local_118.elempack = 0;
          local_118.dims = 0;
          local_118.w = 0;
          local_118.h = 0;
          local_118.d = 0;
          local_118.c = 0;
          lVar6 = lVar6 + 1;
          lVar8 = lVar8 + sVar7;
        } while (lVar6 < this->group);
      }
      if (&this->weight_data != &local_1b8) {
        piVar2 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = (this->weight_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            __ptr = (this->weight_data).data;
            pAVar3 = (this->weight_data).allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data).cstep = 0;
        *(undefined8 *)((long)&(this->weight_data).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->weight_data).elemsize + 4) = 0;
        (this->weight_data).data = (void *)0x0;
        (this->weight_data).refcount = (int *)0x0;
        (this->weight_data).dims = 0;
        (this->weight_data).w = 0;
        (this->weight_data).h = 0;
        (this->weight_data).d = 0;
        (this->weight_data).c = 0;
        (this->weight_data).data = local_1b8.data;
        (this->weight_data).refcount =
             (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        (this->weight_data).elemsize =
             CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
        (this->weight_data).elempack = local_1b8.elempack;
        (this->weight_data).allocator = local_1b8.allocator;
        (this->weight_data).dims = local_1b8.dims;
        (this->weight_data).w = local_1b8.w;
        (this->weight_data).h = local_1b8.h;
        (this->weight_data).d = local_1b8.d;
        (this->weight_data).c = local_1b8.c;
        (this->weight_data).cstep = local_1b8.cstep;
      }
    }
    piVar2 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (bVar9 || bVar10) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise::create_pipeline(const Option& opt)
{
#if NCNN_INT8
    // runtime quantize the weight data
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_g = weight_data_size / group;

        for (int g = 0; g < group; g++)
        {
            Option opt_q = opt;
            opt_q.blob_allocator = int8_weight_data.allocator;
            opt_q.use_packing_layout = false;

            const Mat weight_data_g = weight_data.range(weight_data_size_g * g, weight_data_size_g);
            Mat int8_weight_data_g = int8_weight_data.range(weight_data_size_g * g, weight_data_size_g);
            const Mat weight_data_int8_scales_g = weight_data_int8_scales.range(g, 1);
            quantize_to_int8(weight_data_g, int8_weight_data_g, weight_data_int8_scales_g, opt_q);
        }

        weight_data = int8_weight_data;
    }
#else
    (void)(opt);
#endif // NCNN_INT8

    return 0;
}